

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_errors.hpp
# Opt level: O0

void Fossilize::log_error_pnext_chain(string *what,void *pNext)

{
  FILE *__stream;
  bool bVar1;
  LogLevel LVar2;
  undefined8 uVar3;
  string local_40;
  VkBaseInStructure *local_20;
  VkBaseInStructure *next;
  void *pNext_local;
  string *what_local;
  
  next = (VkBaseInStructure *)pNext;
  pNext_local = what;
  std::__cxx11::string::operator+=((string *)what," (pNext->sType chain: [");
  while (next != (VkBaseInStructure *)0x0) {
    local_20 = next;
    std::__cxx11::to_string(&local_40,next->sType);
    std::__cxx11::string::operator+=((string *)what,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    next = local_20->pNext;
    if (next != (VkBaseInStructure *)0x0) {
      std::__cxx11::string::operator+=((string *)what,", ");
    }
  }
  std::__cxx11::string::operator+=((string *)what,"])");
  LVar2 = get_thread_log_level();
  if ((int)LVar2 < 2) {
    uVar3 = std::__cxx11::string::c_str();
    bVar1 = Internal::log_thread_callback(LOG_DEFAULT,"%s\n",uVar3);
    __stream = _stderr;
    if (!bVar1) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"Fossilize WARN: %s\n",uVar3);
    }
  }
  return;
}

Assistant:

static inline void log_error_pnext_chain(std::string what, const void *pNext)
{
	what += " (pNext->sType chain: [";
	while (pNext != nullptr)
	{
		auto *next = static_cast<const VkBaseInStructure *>(pNext);
		what += std::to_string(next->sType);
		pNext = next->pNext;
		if (pNext != nullptr)
			what += ", ";
	}
	what += "])";
	LOGW_LEVEL("%s\n", what.c_str());
}